

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

NumberStringBuilder * __thiscall
icu_63::number::impl::NumberStringBuilder::operator=
          (NumberStringBuilder *this,NumberStringBuilder *other)

{
  int32_t iVar1;
  char cVar2;
  char16_t *buffer;
  UNumberFormatFields *buffer_00;
  uint uVar3;
  ValueOrHeapArray<char16_t> *__src;
  ValueOrHeapArray<UNumberFormatFields> *__src_00;
  ValueOrHeapArray<char16_t> *__dest;
  ValueOrHeapArray<UNumberFormatFields> *__dest_00;
  NumberStringBuilder local_128;
  
  if (this == other) {
    return this;
  }
  cVar2 = this->fUsingHeap;
  if ((bool)cVar2 == true) {
    uprv_free_63((this->fChars).heap.ptr);
    uprv_free_63((this->fFields).heap.ptr);
    this->fUsingHeap = false;
    cVar2 = '\0';
  }
  if (other->fUsingHeap == false) {
    uVar3 = 0x28;
  }
  else {
    uVar3 = (other->fChars).heap.capacity;
  }
  if ((int)uVar3 < 0x29) {
    if (uVar3 == 0) goto LAB_002634b1;
  }
  else {
    buffer = (char16_t *)uprv_malloc_63((ulong)uVar3 * 2);
    buffer_00 = (UNumberFormatFields *)uprv_malloc_63((ulong)uVar3 << 2);
    if (buffer == (char16_t *)0x0 || buffer_00 == (UNumberFormatFields *)0x0) {
      uprv_free_63(buffer);
      uprv_free_63(buffer_00);
      local_128.fUsingHeap = false;
      local_128.fZero = 0x14;
      local_128.fLength = 0;
      operator=(this,&local_128);
      ~NumberStringBuilder(&local_128);
      return this;
    }
    this->fUsingHeap = true;
    (this->fChars).heap.capacity = uVar3;
    (this->fChars).heap.ptr = buffer;
    (this->fFields).heap.capacity = uVar3;
    (this->fFields).heap.ptr = buffer_00;
    cVar2 = '\x01';
  }
  if (other->fUsingHeap == false) {
    __src = &other->fChars;
  }
  else {
    __src = (ValueOrHeapArray<char16_t> *)(other->fChars).heap.ptr;
  }
  if (cVar2 == '\0') {
    __dest = &this->fChars;
  }
  else {
    __dest = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
  }
  memcpy(__dest,__src,(long)(int)uVar3 * 2);
  if (other->fUsingHeap == false) {
    __src_00 = &other->fFields;
  }
  else {
    __src_00 = (ValueOrHeapArray<UNumberFormatFields> *)(other->fFields).heap.ptr;
  }
  if (this->fUsingHeap == false) {
    __dest_00 = &this->fFields;
  }
  else {
    __dest_00 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
  }
  memcpy(__dest_00,__src_00,(long)(int)uVar3 << 2);
LAB_002634b1:
  iVar1 = other->fLength;
  this->fZero = other->fZero;
  this->fLength = iVar1;
  return this;
}

Assistant:

NumberStringBuilder &NumberStringBuilder::operator=(const NumberStringBuilder &other) {
    // Check for self-assignment
    if (this == &other) {
        return *this;
    }

    // Continue with deallocation and copying
    if (fUsingHeap) {
        uprv_free(fChars.heap.ptr);
        uprv_free(fFields.heap.ptr);
        fUsingHeap = false;
    }

    int32_t capacity = other.getCapacity();
    if (capacity > DEFAULT_CAPACITY) {
        // FIXME: uprv_malloc
        // C++ note: malloc appears in two places: here and in prepareForInsertHelper.
        auto newChars = static_cast<char16_t *> (uprv_malloc(sizeof(char16_t) * capacity));
        auto newFields = static_cast<Field *>(uprv_malloc(sizeof(Field) * capacity));
        if (newChars == nullptr || newFields == nullptr) {
            // UErrorCode is not available; fail silently.
            uprv_free(newChars);
            uprv_free(newFields);
            *this = NumberStringBuilder();  // can't fail
            return *this;
        }

        fUsingHeap = true;
        fChars.heap.capacity = capacity;
        fChars.heap.ptr = newChars;
        fFields.heap.capacity = capacity;
        fFields.heap.ptr = newFields;
    }

    uprv_memcpy2(getCharPtr(), other.getCharPtr(), sizeof(char16_t) * capacity);
    uprv_memcpy2(getFieldPtr(), other.getFieldPtr(), sizeof(Field) * capacity);

    fZero = other.fZero;
    fLength = other.fLength;
    return *this;
}